

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *err)

{
  uint uVar1;
  ostream *poVar2;
  string filepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string warning;
  ifstream matIStream;
  uint auStack_210 [122];
  
  filepath._M_dataplus._M_p = (pointer)&filepath.field_2;
  filepath._M_string_length = 0;
  filepath.field_2._M_local_buf[0] = '\0';
  if ((this->m_mtlBaseDir)._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&filepath,matId);
  }
  else {
    std::__cxx11::string::string((string *)&warning,&this->m_mtlBaseDir);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&matIStream,
                   &warning,matId);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&filepath,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&matIStream);
    std::__cxx11::string::~string((string *)&matIStream);
    std::__cxx11::string::~string((string *)&warning);
  }
  std::ifstream::ifstream(&matIStream,filepath._M_dataplus._M_p,_S_in);
  uVar1 = *(uint *)((long)auStack_210 + *(long *)(_matIStream + -0x18));
  if ((uVar1 & 5) == 0) {
    warning._M_dataplus._M_p = (pointer)&warning.field_2;
    warning._M_string_length = 0;
    warning.field_2._M_local_buf[0] = '\0';
    LoadMtl(matMap,materials,(istream *)&matIStream,&warning);
    if ((err != (string *)0x0) && (warning._M_string_length != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (err,&warning);
    }
    std::__cxx11::string::~string((string *)&warning);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&warning);
    poVar2 = std::operator<<((ostream *)warning.field_2._M_local_buf,"WARN: Material file [ ");
    poVar2 = std::operator<<(poVar2,(string *)&filepath);
    poVar2 = std::operator<<(poVar2," ] not found.");
    std::endl<char,std::char_traits<char>>(poVar2);
    if (err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (err,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&warning);
  }
  std::ifstream::~ifstream(&matIStream);
  std::__cxx11::string::~string((string *)&filepath);
  return (uVar1 & 5) == 0;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *err) {
  std::string filepath;

  if (!m_mtlBaseDir.empty()) {
    filepath = std::string(m_mtlBaseDir) + matId;
  } else {
    filepath = matId;
  }

  std::ifstream matIStream(filepath.c_str());
  if (!matIStream) {
    std::stringstream ss;
    ss << "WARN: Material file [ " << filepath << " ] not found." << std::endl;
    if (err) {
      (*err) += ss.str();
    }
    return false;
  }

  std::string warning;
  LoadMtl(matMap, materials, &matIStream, &warning);

  if (!warning.empty()) {
    if (err) {
      (*err) += warning;
    }
  }

  return true;
}